

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_RequiresFlags_Test::~TApp_RequiresFlags_Test(TApp_RequiresFlags_Test *this)

{
  TApp_RequiresFlags_Test *this_local;
  
  ~TApp_RequiresFlags_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, RequiresFlags) {
    CLI::Option *opt = app.add_flag("-s,--string");
    app.add_flag("--both")->requires(opt);

    run();

    app.reset();
    args = {"-s"};
    run();

    app.reset();
    args = {"-s", "--both"};
    run();

    app.reset();
    args = {"--both"};
    EXPECT_THROW(run(), CLI::RequiresError);
}